

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O2

void __thiscall
ggml_backend_cpu_device_context::ggml_backend_cpu_device_context
          (ggml_backend_cpu_device_context *this)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char buf [1024];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"CPU",(allocator<char> *)buf);
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream != (FILE *)0x0) {
    do {
      pcVar2 = fgets(buf,0x400,__stream);
      if (pcVar2 == (char *)0x0) goto LAB_00111d04;
      iVar1 = bcmp(buf,"model name",10);
    } while ((iVar1 != 0) || (pcVar2 = strchr(buf,0x3a), pcVar2 == (char *)0x0));
    do {
      pcVar4 = pcVar2;
      pcVar2 = pcVar4 + 1;
      iVar1 = isspace((int)pcVar4[1]);
    } while (iVar1 != 0);
    while( true ) {
      sVar3 = strlen(pcVar2);
      iVar1 = isspace((int)pcVar2[sVar3 - 1]);
      if (iVar1 == 0) break;
      pcVar4[sVar3] = '\0';
    }
    std::__cxx11::string::assign((char *)this);
LAB_00111d04:
    fclose(__stream);
  }
  return;
}

Assistant:

ggml_backend_cpu_device_context() {
#ifdef __APPLE__
        size_t len = 0;
        if (!sysctlbyname("machdep.cpu.brand_string", NULL, &len, NULL, 0)) {
            description.resize(len);
            sysctlbyname("machdep.cpu.brand_string", &description[0], &len, NULL, 0); // NOLINT
        }
#elif defined(__linux__)
        FILE * f = fopen("/proc/cpuinfo", "r");
        if (f) {
            char buf[1024];
            while (fgets(buf, sizeof(buf), f)) {
                if (strncmp(buf, "model name", 10) == 0) {
                    char * p = strchr(buf, ':');
                    if (p) {
                        p++;
                        while (std::isspace(*p)) {
                            p++;
                        }
                        while (std::isspace(p[strlen(p) - 1])) {
                            p[strlen(p) - 1] = '\0';
                        }
                        description = p;
                        break;
                    }
                }
            }
            fclose(f);
        }
#elif defined(_WIN32)
        HKEY hKey;
        if (RegOpenKeyEx(HKEY_LOCAL_MACHINE,
                        TEXT("HARDWARE\\DESCRIPTION\\System\\CentralProcessor\\0"),
                        0,
                        KEY_READ,
                        &hKey) == ERROR_SUCCESS) {
            DWORD cpu_brand_size = 0;
            if (RegQueryValueExA(hKey,
                                "ProcessorNameString",
                                NULL,
                                NULL,
                                NULL,
                                &cpu_brand_size) == ERROR_SUCCESS) {
                description.resize(cpu_brand_size);
                if (RegQueryValueExA(hKey,
                                    "ProcessorNameString",
                                    NULL,
                                    NULL,
                                    (LPBYTE)&description[0], // NOLINT
                                    &cpu_brand_size) == ERROR_SUCCESS) {
                    if (description.find('\0') != std::string::npos) {
                        description.resize(description.find('\0'));
                    }
                }
            }
            RegCloseKey(hKey);
        }
#endif
    }